

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O0

bool piece_visible_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  Am_Object local_40 [3];
  Am_Object local_28;
  undefined1 local_1d;
  int local_1c;
  bool black_player;
  Am_Object *pAStack_18;
  int rank;
  Am_Object *self_local;
  
  pAStack_18 = self;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  local_1c = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)pAStack_18,(ulong)BLACK_PLAYER);
  local_1d = Am_Value::operator_cast_to_bool(pAVar1);
  if ((bool)local_1d) {
    Am_Object::Get_Object((ushort)&local_28,0x110320);
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_28,0x69);
    self_local._7_1_ = Am_Value::operator_cast_to_bool(pAVar1);
    Am_Object::~Am_Object(&local_28);
  }
  else {
    Am_Object::Get_Object((ushort)local_40,0x110318);
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)local_40,0x69);
    self_local._7_1_ = Am_Value::operator_cast_to_bool(pAVar1);
    Am_Object::~Am_Object(local_40);
  }
  return (bool)(self_local._7_1_ & 1);
}

Assistant:

Am_Define_Formula(bool, piece_visible)
{
  int rank = self.Get(Am_RANK);
  bool black_player = self.Get(BLACK_PLAYER);
  if (black_player)
    return (bool)Black_Pieces.Get_Object(piece_slot[rank]).Get(Am_VISIBLE);
  else
    return (bool)Red_Pieces.Get_Object(piece_slot[rank]).Get(Am_VISIBLE);
}